

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCount.cpp
# Opt level: O2

int countChildElements(DOMNode *n,bool printOutEncounteredEles)

{
  char cVar1;
  int iVar2;
  wchar16 *pwVar3;
  char *pcVar4;
  ostream *poVar5;
  long *plVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  XMLSize_t i;
  long lVar8;
  char *name_1;
  undefined4 local_4c;
  long *local_48;
  long local_40;
  char *name;
  
  if (n == (DOMNode *)0x0) {
    uVar7 = 0;
  }
  else {
    iVar2 = (**(code **)(*(long *)n + 0x20))();
    if (iVar2 == 1 && printOutEncounteredEles) {
      local_4c = (undefined4)CONCAT71(in_register_00000031,printOutEncounteredEles);
      pwVar3 = (wchar16 *)(**(code **)(*(long *)n + 0x10))(n);
      pcVar4 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      name = pcVar4;
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "----------------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Encountered Element : ");
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar5);
      xercesc_4_0::XMLString::release(&name,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      cVar1 = (**(code **)(*(long *)n + 0xd0))(n);
      if (cVar1 != '\0') {
        local_48 = (long *)(**(code **)(*(long *)n + 0x58))(n);
        local_40 = (**(code **)(*local_48 + 0x28))();
        poVar5 = std::operator<<((ostream *)&std::cout,"\tAttributes");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"\t----------");
        std::endl<char,std::char_traits<char>>(poVar5);
        for (lVar8 = 0; local_40 != lVar8; lVar8 = lVar8 + 1) {
          plVar6 = (long *)(**(code **)(*local_48 + 0x18))(local_48,lVar8);
          pwVar3 = (wchar16 *)(**(code **)(*plVar6 + 0x140))(plVar6);
          name_1 = (char *)xercesc_4_0::XMLString::transcode
                                     (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          poVar5 = std::operator<<((ostream *)&std::cout,"\t");
          poVar5 = std::operator<<(poVar5,name_1);
          std::operator<<(poVar5,"=");
          xercesc_4_0::XMLString::release(&name_1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          pwVar3 = (wchar16 *)(**(code **)(*plVar6 + 0x150))(plVar6);
          name_1 = (char *)xercesc_4_0::XMLString::transcode
                                     (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          poVar5 = std::operator<<((ostream *)&std::cout,name_1);
          std::endl<char,std::char_traits<char>>(poVar5);
          xercesc_4_0::XMLString::release(&name_1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        }
      }
      uVar7 = 1;
      printOutEncounteredEles = SUB41(local_4c,0);
    }
    else {
      uVar7 = (uint)(iVar2 == 1);
    }
    lVar8 = 0x38;
    while( true ) {
      n = (DOMNode *)(**(code **)(*(long *)n + lVar8))(n);
      if (n == (DOMNode *)0x0) break;
      iVar2 = countChildElements(n,printOutEncounteredEles);
      uVar7 = uVar7 + iVar2;
      lVar8 = 0x50;
    }
  }
  return uVar7;
}

Assistant:

static int countChildElements(DOMNode *n, bool printOutEncounteredEles)
{
    DOMNode *child;
    int count = 0;
    if (n) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE)
		{
            if(printOutEncounteredEles) {
                char *name = XMLString::transcode(n->getNodeName());
                std::cout <<"----------------------------------------------------------"<<std::endl;
                std::cout <<"Encountered Element : "<< name << std::endl;

                XMLString::release(&name);

                if(n->hasAttributes()) {
                    // get all the attributes of the node
                    DOMNamedNodeMap *pAttributes = n->getAttributes();
                    const XMLSize_t nSize = pAttributes->getLength();
                    std::cout <<"\tAttributes" << std::endl;
                    std::cout <<"\t----------" << std::endl;
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        // get attribute name
                        char *name = XMLString::transcode(pAttributeNode->getName());

                        std::cout << "\t" << name << "=";
                        XMLString::release(&name);

                        // get attribute type
                        name = XMLString::transcode(pAttributeNode->getValue());
                        std::cout << name << std::endl;
                        XMLString::release(&name);
                    }
                }
            }
			++count;
		}
        for (child = n->getFirstChild(); child != 0; child=child->getNextSibling())
            count += countChildElements(child, printOutEncounteredEles);
    }
    return count;
}